

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockExpectedCall_callWithStringParameter_TestShell::createTest
          (TEST_MockExpectedCall_callWithStringParameter_TestShell *this)

{
  TEST_MockExpectedCall_callWithStringParameter_Test *this_00;
  TEST_MockExpectedCall_callWithStringParameter_TestShell *this_local;
  
  this_00 = (TEST_MockExpectedCall_callWithStringParameter_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0x11b);
  TEST_MockExpectedCall_callWithStringParameter_Test::
  TEST_MockExpectedCall_callWithStringParameter_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCall, callWithStringParameter)
{
    const SimpleString paramName = "paramName";
    const char* value = "hello world";
    call->withParameter(paramName, value);
    STRCMP_EQUAL("const char*", call->getInputParameterType(paramName).asCharString());
    STRCMP_EQUAL(value, call->getInputParameter(paramName).getStringValue());
    STRCMP_CONTAINS("funcName -> const char* paramName: <hello world>", call->callToString().asCharString());
}